

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPackageCommand.cxx
# Opt level: O1

void __thiscall
cmFileListGeneratorFixed::cmFileListGeneratorFixed(cmFileListGeneratorFixed *this,string *str)

{
  pointer pcVar1;
  
  (this->super_cmFileListGeneratorBase)._vptr_cmFileListGeneratorBase = (_func_int **)0x0;
  (this->super_cmFileListGeneratorBase).Next.x_ = (cmFileListGeneratorBase *)0x0;
  (this->super_cmFileListGeneratorBase).Next.x_ = (cmFileListGeneratorBase *)0x0;
  (this->super_cmFileListGeneratorBase)._vptr_cmFileListGeneratorBase =
       (_func_int **)&PTR__cmFileListGeneratorFixed_00615cd8;
  (this->String)._M_dataplus._M_p = (pointer)&(this->String).field_2;
  pcVar1 = (str->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&this->String,pcVar1,pcVar1 + str->_M_string_length);
  return;
}

Assistant:

cmFileListGeneratorFixed(std::string const& str):
    cmFileListGeneratorBase(), String(str) {}